

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

Move<vk::VkCommandBuffer_s_*> *
vkt::wsi::anon_unknown_0::createCommandBuffer
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkCommandPool commandPool,VkPipelineLayout pipelineLayout,
          VkRenderPass renderPass,VkFramebuffer framebuffer,VkPipeline pipeline,size_t frameNdx,
          deUint32 quadCount,deUint32 imageWidth,deUint32 imageHeight)

{
  VkResult VVar1;
  VkCommandBuffer_s **ppVVar2;
  VkClearValue VVar3;
  undefined4 local_f0 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue clearValue;
  undefined8 uStack_88;
  VkCommandBufferBeginInfo beginInfo;
  VkCommandBufferAllocateInfo allocateInfo;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkPipeline pipeline_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  VkPipelineLayout pipelineLayout_local;
  VkCommandPool commandPool_local;
  Move<vk::VkCommandBuffer_s_*> *commandBuffer;
  
  beginInfo.pInheritanceInfo._0_4_ = 0x28;
  beginInfo.pNext = (void *)0x0;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 0;
  uStack_88 = 0x2a;
  beginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  beginInfo._4_4_ = 0;
  ::vk::allocateCommandBuffer
            (__return_storage_ptr__,vkd,device,
             (VkCommandBufferAllocateInfo *)&beginInfo.pInheritanceInfo);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar1 = (*vkd->_vptr_DeviceInterface[0x49])(vkd,*ppVVar2,&uStack_88);
  ::vk::checkResult(VVar1,"vkd.beginCommandBuffer(*commandBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x12f);
  VVar3 = ::vk::makeClearValueColorF32(0.25,0.5,0.75,1.0);
  register0x00000000 = VVar3.depthStencil;
  local_f0[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  renderPassBeginInfo.renderPass.m_internal = framebuffer.m_internal;
  renderPassBeginInfo.framebuffer.m_internal._0_4_ = 0;
  renderPassBeginInfo.framebuffer.m_internal._4_4_ = 0;
  renderPassBeginInfo.renderArea.offset.x = imageWidth;
  renderPassBeginInfo.renderArea.offset.y = imageHeight;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = (long)&renderPassBeginInfo.pClearValues + 4;
  renderPassBeginInfo.pNext = (void *)renderPass.m_internal;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vkd->_vptr_DeviceInterface[0x74])(vkd,*ppVVar2,local_f0,0);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  cmdRenderFrame(vkd,*ppVVar2,pipelineLayout,pipeline,frameNdx,quadCount);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vkd->_vptr_DeviceInterface[0x76])(vkd,*ppVVar2);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar1 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,*ppVVar2);
  ::vk::checkResult(VVar1,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x149);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkCommandBuffer> createCommandBuffer (const vk::DeviceInterface&	vkd,
												   vk::VkDevice					device,
												   vk::VkCommandPool			commandPool,
												   vk::VkPipelineLayout			pipelineLayout,
												   vk::VkRenderPass				renderPass,
												   vk::VkFramebuffer			framebuffer,
												   vk::VkPipeline				pipeline,
												   size_t						frameNdx,
												   deUint32						quadCount,
												   deUint32						imageWidth,
												   deUint32						imageHeight)
{
	const vk::VkCommandBufferAllocateInfo allocateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
		DE_NULL,

		commandPool,
		vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY,
		1
	};
	const vk::VkCommandBufferBeginInfo	beginInfo		=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0u,
		DE_NULL
	};

	vk::Move<vk::VkCommandBuffer>	commandBuffer	(vk::allocateCommandBuffer(vkd, device, &allocateInfo));
	VK_CHECK(vkd.beginCommandBuffer(*commandBuffer, &beginInfo));

	{
		const vk::VkClearValue			clearValue			= vk::makeClearValueColorF32(0.25f, 0.50f, 0.75f, 1.00f);
		const vk::VkRenderPassBeginInfo	renderPassBeginInfo	=
		{
			vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,
			DE_NULL,

			renderPass,
			framebuffer,

			{
				{ (deInt32)0, (deInt32)0 },
				{ imageWidth, imageHeight }
			},
			1u,
			&clearValue
		};
		vkd.cmdBeginRenderPass(*commandBuffer, &renderPassBeginInfo, vk::VK_SUBPASS_CONTENTS_INLINE);
	}

	cmdRenderFrame(vkd, *commandBuffer, pipelineLayout, pipeline, frameNdx, quadCount);

	vkd.cmdEndRenderPass(*commandBuffer);

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	return commandBuffer;
}